

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O2

void dumb_remove_clicks(DUMB_CLICK_REMOVER *cr,sample_t_conflict *samples,int32 length,int step,
                       double halflife)

{
  uint uVar1;
  DUMB_CLICK *pDVar2;
  DUMB_CLICK *pDVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dVar10 = exp2(-1.0 / halflife);
    dVar10 = floor(dVar10 * 2147483648.0);
    pDVar3 = dumb_click_mergesort(cr->click,cr->n_clicks);
    cr->click = (DUMB_CLICK *)0x0;
    cr->n_clicks = 0;
    lVar4 = (long)(int)dVar10;
    lVar5 = (long)step;
    lVar6 = 0;
    while (iVar7 = (int)lVar6, pDVar3 != (DUMB_CLICK *)0x0) {
      pDVar2 = pDVar3->next;
      lVar9 = pDVar3->pos * lVar5;
      uVar1 = cr->offset;
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 0) {
        uVar8 = (ulong)-uVar1;
        for (lVar6 = (long)iVar7; iVar7 = (int)uVar8, lVar6 < (int)lVar9; lVar6 = lVar6 + lVar5) {
          samples[lVar6] = samples[lVar6] - iVar7;
          uVar8 = (ulong)((iVar7 * 2) * lVar4) >> 0x20;
        }
        iVar7 = -iVar7;
      }
      else {
        for (lVar6 = (long)iVar7; iVar7 = (int)uVar8, lVar6 < lVar9; lVar6 = lVar6 + lVar5) {
          samples[lVar6] = samples[lVar6] + iVar7;
          uVar8 = (ulong)((iVar7 * 2) * lVar4) >> 0x20;
        }
      }
      cr->offset = iVar7 - pDVar3->step;
      pDVar3->next = cr->free_clicks;
      cr->free_clicks = pDVar3;
      pDVar3 = pDVar2;
    }
    uVar1 = cr->offset;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      uVar8 = (ulong)-uVar1;
      for (lVar6 = (long)iVar7; iVar7 = (int)uVar8, lVar6 < step * length; lVar6 = lVar6 + lVar5) {
        samples[lVar6] = samples[lVar6] - iVar7;
        uVar8 = (ulong)((iVar7 * 2) * lVar4) >> 0x20;
      }
      iVar7 = -iVar7;
    }
    else {
      for (lVar6 = (long)iVar7; iVar7 = (int)uVar8, lVar6 < step * length; lVar6 = lVar6 + lVar5) {
        samples[lVar6] = samples[lVar6] + iVar7;
        uVar8 = (ulong)((iVar7 * 2) * lVar4) >> 0x20;
      }
    }
    cr->offset = iVar7;
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks(DUMB_CLICK_REMOVER *cr, sample_t *samples, int32 length, int step, double halflife)
{
	DUMB_CLICK *click;
	int32 pos = 0;
	int offset;
	int factor;

	if (!cr) return;

	factor = (int)floor(pow(0.5, 1.0/halflife) * (1U << 31));

	click = dumb_click_mergesort(cr->click, cr->n_clicks);
	cr->click = NULL;
	cr->n_clicks = 0;

	length *= step;

	while (click) {
		DUMB_CLICK *next = click->next;
		int end = click->pos * step;
		ASSERT(end <= length);
		offset = cr->offset;
		if (offset < 0) {
			offset = -offset;
			while (pos < end) {
				samples[pos] -= offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
			offset = -offset;
		} else {
			while (pos < end) {
				samples[pos] += offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
		}
		cr->offset = offset - click->step;
		free_click(cr, click);
		click = next;
	}

	offset = cr->offset;
	if (offset < 0) {
		offset = -offset;
		while (pos < length) {
			samples[pos] -= offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
		offset = -offset;
	} else {
		while (pos < length) {
			samples[pos] += offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
	}
	cr->offset = offset;
}